

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O2

bool __thiscall CaptureSummary::Load(CaptureSummary *this,char *file_name)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  bool bVar3;
  CaptureLine line;
  char buffer [512];
  
  __stream = (FILE *)ithi_file_open(file_name,"r");
  bVar3 = __stream != (FILE *)0x0;
  while (bVar3 != false) {
    pcVar2 = fgets(buffer,0x200,__stream);
    if (pcVar2 == (char *)0x0) break;
    iVar1 = CsvHelper::read_string(line.registry_name,0x40,0,buffer,0x200);
    iVar1 = CsvHelper::read_number(&line.key_type,(long)iVar1,buffer,0x200);
    if (line.key_type == 0) {
      iVar1 = CsvHelper::read_number(&line.field_2.key_number,(long)iVar1,buffer,0x200);
    }
    else {
      iVar1 = CsvHelper::read_string(line.field_2.key_value,0x80,(long)iVar1,buffer,0x200);
    }
    CsvHelper::read_number64(&line.count,(long)iVar1,buffer,0x200);
    pcVar2 = DnsStats::GetTableName(0);
    iVar1 = strcmp(line.registry_name,pcVar2);
    if (iVar1 == 0) {
      this->capture_version = (int)line.count;
      bVar3 = true;
    }
    else {
      AddLine(this,&line,true);
      bVar3 = true;
    }
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return bVar3;
}

Assistant:

bool CaptureSummary::Load(char const * file_name)
{
    CaptureLine line;
    char buffer[512];
    FILE * F = ithi_file_open(file_name, "r");
    bool ret = (F != NULL);

    while ( ret && fgets(buffer, sizeof(buffer), F))
    {
        int start = 0;
        start = CsvHelper::read_string(line.registry_name, sizeof(line.registry_name), start, buffer, sizeof(buffer));
        start = CsvHelper::read_number(&line.key_type, start, buffer, sizeof(buffer));
        if (line.key_type == 0)
        {
            start = CsvHelper::read_number(&line.key_number, start, buffer, sizeof(buffer));
        }
        else
        {
            start = CsvHelper::read_string(line.key_value, sizeof(line.key_value), start, buffer, sizeof(buffer));
        }
        (void)CsvHelper::read_number64(&line.count, start, buffer, sizeof(buffer));


        /* TODO: check that the parsing is good */

        /* Notice the version number */
        if (strcmp(line.registry_name, DnsStats::GetTableName(REGISTRY_ITHITOOLS_VERSION)) == 0) {
            capture_version = (int) line.count;
        } else {
            /* allocate data and add to vector */
            ret = AddLine(&line, true);
        }
    }

    if (F != NULL)
    {
        fclose(F);
    }
    return ret;
}